

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

ON_GradientColorData *
ON_GradientColorData::FromObject(ON_Object *obj,bool createAndAttachIfMissing)

{
  bool bVar1;
  ON_UserData *p;
  ON_GradientColorData *pOVar2;
  ON_UUID local_28;
  
  if (obj != (ON_Object *)0x0) {
    local_28 = ON_ClassId::Uuid(&m_ON_GradientColorData_class_rtti);
    p = ON_Object::GetUserData(obj,&local_28);
    pOVar2 = Cast(&p->super_ON_Object);
    if (!createAndAttachIfMissing || pOVar2 != (ON_GradientColorData *)0x0) {
      return pOVar2;
    }
    pOVar2 = (ON_GradientColorData *)operator_new(0x120);
    ON_GradientColorData(pOVar2);
    bVar1 = ON_Object::AttachUserData(obj,(ON_UserData *)pOVar2);
    if (bVar1) {
      return pOVar2;
    }
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  return (ON_GradientColorData *)0x0;
}

Assistant:

ON_GradientColorData* ON_GradientColorData::FromObject(ON_Object* obj, bool createAndAttachIfMissing)
{
  if (nullptr == obj)
    return nullptr;
  ON_GradientColorData* rc = ON_GradientColorData::Cast(obj->GetUserData(ON_CLASS_ID(ON_GradientColorData)));
  if (nullptr == rc && createAndAttachIfMissing)
  {
    rc = new ON_GradientColorData();
    if (!obj->AttachUserData(rc))
    {
      delete rc;
      return nullptr;
    }
  }
  return rc;
}